

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

TimingControl * __thiscall
slang::ast::ContinuousAssignSymbol::getDelay(ContinuousAssignSymbol *this)

{
  TimingControlSyntax *pTVar1;
  SyntaxNode *scope_00;
  bool bVar2;
  int iVar3;
  ContinuousAssignSyntax *pCVar4;
  undefined4 extraout_var;
  TimingControl **ppTVar5;
  Delay3Control *pDVar6;
  Expression *this_00;
  AssignmentExpression *this_01;
  socklen_t __len;
  LookupLocation LVar7;
  ExpressionVarVisitor local_c9;
  Expression *pEStack_c8;
  ExpressionVarVisitor visitor;
  Expression *left;
  Expression *expr;
  Delay3Control *d3;
  TimingControl *d;
  bitmask<slang::ast::ASTFlags> local_a0;
  Scope *local_98;
  uint32_t local_90;
  Scope *local_88;
  uint32_t local_80;
  undefined1 local_78 [8];
  ASTContext context;
  TimingControlSyntax *delaySyntax;
  SyntaxNode *local_28;
  SyntaxNode *syntax;
  Scope *scope;
  ContinuousAssignSymbol *this_local;
  
  scope = (Scope *)this;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this->delay);
  if (bVar2) {
    ppTVar5 = std::optional<const_slang::ast::TimingControl_*>::operator*(&this->delay);
    this_local = (ContinuousAssignSymbol *)*ppTVar5;
  }
  else {
    syntax = (SyntaxNode *)Symbol::getParentScope(&this->super_Symbol);
    local_28 = Symbol::getSyntax(&this->super_Symbol);
    if (((syntax == (SyntaxNode *)0x0) || (local_28 == (SyntaxNode *)0x0)) ||
       (local_28->parent == (SyntaxNode *)0x0)) {
      delaySyntax = (TimingControlSyntax *)0x0;
      std::optional<slang::ast::TimingControl_const*>::operator=
                ((optional<slang::ast::TimingControl_const*> *)&this->delay,&delaySyntax);
      this_local = (ContinuousAssignSymbol *)0x0;
    }
    else {
      pCVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ContinuousAssignSyntax>
                         (local_28->parent);
      scope_00 = syntax;
      pTVar1 = pCVar4->delay;
      if (pTVar1 == (TimingControlSyntax *)0x0) {
        context.assertionInstance = (AssertionInstanceDetails *)0x0;
        std::optional<slang::ast::TimingControl_const*>::operator=
                  ((optional<slang::ast::TimingControl_const*> *)&this->delay,
                   &context.assertionInstance);
        this_local = (ContinuousAssignSymbol *)0x0;
      }
      else {
        LVar7 = LookupLocation::before(&this->super_Symbol);
        local_98 = LVar7.scope;
        local_90 = LVar7.index;
        local_88 = local_98;
        local_80 = local_90;
        bitmask<slang::ast::ASTFlags>::bitmask(&local_a0,NonProcedural);
        LVar7.index = local_80;
        LVar7.scope = local_88;
        LVar7._12_4_ = 0;
        ASTContext::ASTContext((ASTContext *)local_78,(Scope *)scope_00,LVar7,local_a0);
        iVar3 = TimingControl::bind((int)pTVar1,(sockaddr *)local_78,__len);
        d = (TimingControl *)CONCAT44(extraout_var,iVar3);
        std::optional<slang::ast::TimingControl_const*>::operator=
                  ((optional<slang::ast::TimingControl_const*> *)&this->delay,&d);
        ppTVar5 = std::optional<const_slang::ast::TimingControl_*>::value(&this->delay);
        if ((((*ppTVar5)->kind == Delay3) &&
            (pDVar6 = TimingControl::as<slang::ast::Delay3Control>(*ppTVar5),
            pDVar6->expr2 != (Expression *)0x0)) &&
           (this_00 = getAssignment(this), this_00->kind == Assignment)) {
          this_01 = Expression::as<slang::ast::AssignmentExpression>(this_00);
          pEStack_c8 = AssignmentExpression::left(this_01);
          ExpressionVarVisitor::ExpressionVarVisitor(&local_c9);
          Expression::visit<slang::ast::ExpressionVarVisitor&>(pEStack_c8,&local_c9);
          if ((local_c9.anyVars & 1U) != 0) {
            ASTContext::addDiag((ASTContext *)local_78,(DiagCode)0x190006,pEStack_c8->sourceRange);
          }
        }
        ppTVar5 = std::optional<const_slang::ast::TimingControl_*>::operator*(&this->delay);
        this_local = (ContinuousAssignSymbol *)*ppTVar5;
      }
    }
  }
  return (TimingControl *)this_local;
}

Assistant:

const TimingControl* ContinuousAssignSymbol::getDelay() const {
    if (delay)
        return *delay;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    if (!scope || !syntax || !syntax->parent) {
        delay = nullptr;
        return nullptr;
    }

    auto delaySyntax = syntax->parent->as<ContinuousAssignSyntax>().delay;
    if (!delaySyntax) {
        delay = nullptr;
        return nullptr;
    }

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);
    delay = &TimingControl::bind(*delaySyntax, context);

    // A multi-delay is disallowed if the lhs references variables.
    auto& d = *delay.value();
    if (d.kind == TimingControlKind::Delay3) {
        auto& d3 = d.as<Delay3Control>();
        if (d3.expr2) {
            auto& expr = getAssignment();
            if (expr.kind == ExpressionKind::Assignment) {
                auto& left = expr.as<AssignmentExpression>().left();
                ExpressionVarVisitor visitor;
                left.visit(visitor);
                if (visitor.anyVars)
                    context.addDiag(diag::Delay3OnVar, left.sourceRange);
            }
        }
    }

    return *delay;
}